

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

string * extractFileExt(string *__return_storage_ptr__,string *src)

{
  long lVar1;
  long lVar2;
  _Alloc_hider local_30;
  size_type local_28;
  size_type local_20;
  undefined8 uStack_18;
  
  lVar2 = src->_M_string_length + 1;
  do {
    if (lVar2 == 2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    lVar1 = lVar2 + -2;
    lVar2 = lVar2 + -1;
  } while ((src->_M_dataplus)._M_p[lVar1] != '.');
  std::__cxx11::string::substr((ulong)&local_30,(ulong)src);
  if ((local_28 == 0) || (local_30._M_p[local_28 - 1] != '\"')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((size_type *)local_30._M_p == &local_20) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_18;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_30._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
    }
    __return_storage_ptr__->_M_string_length = local_28;
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
    if ((size_type *)local_30._M_p != &local_20) {
      operator_delete(local_30._M_p,local_20 + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string extractFileExt(const string& src)
{
    for (size_t i = src.size() - 1; i > 0; i--)
        if (src[i] == '.')
        {
            string rez = src.substr(i + 1);
            if (!rez.empty() && rez[rez.size() - 1] == '\"')
                return rez.substr(0, rez.size() - 1);
            return rez;
        }
    return "";
}